

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O1

void Bmcs_ManPrintTime(Bmcs_Man_t *p)

{
  int level;
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  level = (int)p;
  if (p->pPars->fVerbose != 0) {
    lVar1 = p->timeCnf + p->timeUnf + p->timeSat + p->timeOth;
    Abc_Print(level,"%s =","Unfolding     ");
    dVar2 = (double)lVar1;
    dVar3 = 0.0;
    if (lVar1 != 0) {
      dVar3 = ((double)p->timeUnf * 100.0) / dVar2;
    }
    dVar4 = 0.0;
    if (lVar1 != 0) {
      dVar4 = (dVar2 * 100.0) / dVar2;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeUnf / 1000000.0,dVar3);
    Abc_Print(level,"%s =","CNF generation");
    dVar3 = 0.0;
    if (lVar1 != 0) {
      dVar3 = ((double)p->timeCnf * 100.0) / dVar2;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeCnf / 1000000.0,dVar3);
    Abc_Print(level,"%s =","SAT solving   ");
    dVar3 = 0.0;
    if (lVar1 != 0) {
      dVar3 = ((double)p->timeSat * 100.0) / dVar2;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSat / 1000000.0,dVar3);
    Abc_Print(level,"%s =","Other         ");
    dVar3 = 0.0;
    if (lVar1 != 0) {
      dVar3 = ((double)p->timeOth * 100.0) / dVar2;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeOth / 1000000.0,dVar3);
    Abc_Print(level,"%s =","TOTAL         ");
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar2 / 1000000.0,dVar4);
    return;
  }
  return;
}

Assistant:

void Bmcs_ManPrintTime( Bmcs_Man_t * p )
{
    abctime clkTotal = p->timeUnf + p->timeCnf + p->timeSat + p->timeOth;
    if ( !p->pPars->fVerbose )
        return;
    ABC_PRTP( "Unfolding     ", p->timeUnf,  clkTotal );
    ABC_PRTP( "CNF generation", p->timeCnf,  clkTotal );
    ABC_PRTP( "SAT solving   ", p->timeSat,  clkTotal );
    ABC_PRTP( "Other         ", p->timeOth,  clkTotal );
    ABC_PRTP( "TOTAL         ", clkTotal  ,  clkTotal );
}